

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>const>const>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,Matrix<double,__1,__1,_0,__1,__1> *lhs,
               MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>_>
               *rhs,Scalar *alpha)

{
  double *pdVar1;
  Scalar SVar2;
  ActualDstType actualDst;
  ActualLhsType actualLhs;
  undefined4 uVar3;
  undefined4 uVar4;
  RhsNested actual_rhs;
  Matrix<double,__1,_1,_0,__1,_1> local_c8;
  Scalar local_b8;
  const_blas_data_mapper<double,_long,_1> local_b0;
  const_blas_data_mapper<double,_long,_0> local_a0;
  long local_90;
  Matrix<double,__1,__1,_0,__1,__1> *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  LhsNested local_68;
  RhsNested pMStack_60;
  LhsNested local_58;
  RhsNested pMStack_50;
  undefined8 local_40;
  long local_30;
  
  if ((lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows == 1)
  {
    local_a0.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
         (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    local_90 = (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols;
    if (local_90 < 0 &&
        local_a0.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data != (double *)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                    ,0xb2,
                    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                   );
    }
    if (local_90 !=
        (((rhs->m_expression).m_rhs.m_expression.m_lhs)->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows) {
      __assert_fail("size() == other.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Dot.h"
                    ,0x52,
                    "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, OtherDerived = Eigen::Block<const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>>>>, -1, 1, true>]"
                   );
    }
    local_b8 = *alpha;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = 1;
    local_68 = (rhs->m_expression).m_lhs.m_expression.m_lhs;
    pMStack_60 = (rhs->m_expression).m_lhs.m_expression.m_rhs;
    local_58 = (rhs->m_expression).m_rhs.m_expression.m_lhs;
    pMStack_50 = (rhs->m_expression).m_rhs.m_expression.m_rhs;
    local_40 = 0;
    if (local_90 == 0) {
      uVar3 = 0;
      uVar4 = 0;
    }
    else {
      local_88 = lhs;
      local_30 = local_90;
      SVar2 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const,Eigen::Block<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>const>const>const,-1,1,true>const>>
              ::redux<Eigen::internal::scalar_sum_op<double,double>>
                        ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const,Eigen::Block<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const>const>const,_1,1,true>const>>
                          *)&local_a0,(scalar_sum_op<double,_double> *)&local_b0);
      uVar3 = SUB84(SVar2,0);
      uVar4 = (undefined4)((ulong)SVar2 >> 0x20);
    }
    pdVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    *pdVar1 = local_b8 * (double)CONCAT44(uVar4,uVar3) + *pdVar1;
  }
  else {
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const>const>,Eigen::internal::assign_op<double,double>>
              (&local_c8,rhs,(assign_op<double,_double> *)&local_a0);
    local_a0.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride =
         (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_a0.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
         (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    local_b0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_b0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = 1;
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(local_a0.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride,
          (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols,
          &local_a0,&local_b0,
          (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,1,
          *alpha);
    free(local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }